

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS
VerifyJsonParsesAsListOfDictionariesOfNumbers
          (_Bool IsJson5,char *Json,uint32_t ListCount,uint32_t DictionaryCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  JL_STATUS JVar6;
  uint32_t uVar7;
  ulong uVar8;
  WJTL_STATUS WVar9;
  JlDataObject *dictionaryObject;
  JlDataObject *object;
  JlListItem *enumerator;
  JlDataObject *listObject;
  uint64_t u64;
  size_t errorAtPos;
  char keyName [32];
  JlDataObject *local_a0;
  uint32_t local_94;
  JlDataObject *local_90;
  JlListItem *local_88;
  JlDataObject *local_80;
  uint32_t local_78;
  uint32_t local_74;
  uint64_t local_70;
  JlDataObject *local_68;
  size_t local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_80 = (JlDataObject *)0x0;
  local_60 = 100;
  local_88 = (JlListItem *)0x0;
  local_a0 = (JlDataObject *)0x0;
  local_94 = ListCount;
  local_78 = DictionaryCount;
  JVar3 = JlParseJsonEx(Json,IsJson5,&local_80,&local_60);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2f9);
  pJVar1 = local_80;
  WjTestLib_Assert(local_80 != (JlDataObject *)0x0,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fa);
  JVar4 = JlGetObjectType(local_80);
  WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fb);
  sVar2 = local_60;
  WjTestLib_Assert(local_60 == 0,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fc);
  uVar5 = JlGetListCount(local_80);
  uVar7 = local_94;
  WVar9 = WJTL_STATUS_FAILED;
  if (uVar5 == local_94) {
    WVar9 = WJTL_STATUS_SUCCESS;
  }
  if (sVar2 != 0) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_DATA_TYPE_LIST) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (pJVar1 == (JlDataObject *)0x0) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_SUCCESS) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(uVar5 == local_94,"JlGetListCount( listObject ) == ListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fe);
  local_88 = (JlListItem *)0x0;
  uVar5 = local_74;
  if (uVar7 != 0) {
    uVar8 = 0;
    local_74 = 0;
    do {
      local_a0 = (JlDataObject *)0x0;
      JVar3 = JlGetObjectListNextItem(local_80,&local_a0,&local_88);
      WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x304);
      pJVar1 = local_a0;
      WjTestLib_Assert(local_a0 != (JlDataObject *)0x0,"(dictionaryObject) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x305);
      JVar4 = JlGetObjectType(local_a0);
      if (JVar4 != JL_DATA_TYPE_DICTIONARY) {
        WVar9 = WJTL_STATUS_FAILED;
      }
      if (pJVar1 == (JlDataObject *)0x0) {
        WVar9 = WJTL_STATUS_FAILED;
      }
      if (JVar3 != JL_STATUS_SUCCESS) {
        WVar9 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(JVar4 == JL_DATA_TYPE_DICTIONARY,
                       "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x306);
      uVar5 = local_74;
      for (uVar7 = local_78; uVar7 != 0; uVar7 = uVar7 - 1) {
        local_90 = (JlDataObject *)0x0;
        local_70 = 0;
        uVar8 = (ulong)((int)uVar8 + 1);
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_74 = uVar5;
        sprintf((char *)&local_58,"num%u",uVar8);
        JVar3 = JlGetObjectFromDictionaryByKey(local_a0,(char *)&local_58,&local_90);
        WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x311);
        local_68 = local_90;
        WjTestLib_Assert(local_90 != (JlDataObject *)0x0,"(object) != NULL",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x312);
        JVar4 = JlGetObjectType(local_90);
        WjTestLib_Assert(JVar4 == JL_DATA_TYPE_NUMBER,
                         "JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x313);
        JVar6 = JlGetObjectNumberU64(local_90,&local_70);
        WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                         "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x314);
        if (local_70 != uVar8) {
          WVar9 = WJTL_STATUS_FAILED;
        }
        if (JVar6 != JL_STATUS_SUCCESS) {
          WVar9 = WJTL_STATUS_FAILED;
        }
        if (JVar4 != JL_DATA_TYPE_NUMBER) {
          WVar9 = WJTL_STATUS_FAILED;
        }
        if (local_68 == (JlDataObject *)0x0) {
          WVar9 = WJTL_STATUS_FAILED;
        }
        if (JVar3 != JL_STATUS_SUCCESS) {
          WVar9 = WJTL_STATUS_FAILED;
        }
        WjTestLib_Assert(local_70 == uVar8,"u64 == (uint64_t)counter",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                         ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x315);
        uVar5 = local_74;
      }
      local_74 = uVar5 + 1;
    } while (local_74 != local_94);
  }
  local_74 = uVar5;
  JVar3 = JlGetObjectListNextItem(local_80,&local_a0,&local_88);
  WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31a);
  JVar6 = JlFreeObjectTree(&local_80);
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_END_OF_DATA) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31d);
  return WVar9;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfDictionariesOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint32_t        ListCount,
        uint32_t        DictionaryCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   dictionaryObject = NULL;
    uint32_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == ListCount );

    enumerator = NULL;
    for( uint32_t i=0; i<ListCount; i++ )
    {
        dictionaryObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( dictionaryObject );
        JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

        for( uint32_t x=0; x<DictionaryCount; x++ )
        {
            JlDataObject* object = NULL;
            uint64_t u64 = 0;

            counter += 1;
            char keyName [32] = {0};
            sprintf( keyName, "num%u", counter );

            JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT( JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == (uint64_t)counter );
        }
    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}